

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_StringTypeCordNotForExtension_Test
::TestBody(CppGeneratorTest_StringTypeCordNotForExtension_Test *this)

{
  string_view name;
  string_view command;
  string_view expected_substring;
  string_view contents;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    edition = \"2024\";\n    import \"google/protobuf/cpp_features.proto\";\n\n    message Foo {\n      extensions 1 to max;\n    }\n    extend Foo {\n      bytes bar = 1 [features.(pb.cpp).string_type = CORD];\n    }\n  "
  ;
  contents._M_len = 0xd1;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  command._M_str =
       "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir --experimental_editions foo.proto";
  command._M_len = 0x5a;
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,command);
  expected_substring._M_str =
       "Extension bar specifies CORD string type which is not supported for extensions";
  expected_substring._M_len = 0x4e;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, StringTypeCordNotForExtension) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      extensions 1 to max;
    }
    extend Foo {
      bytes bar = 1 [features.(pb.cpp).string_type = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectErrorSubstring(
      "Extension bar specifies CORD string type which is not supported for "
      "extensions");
}